

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_object.c
# Opt level: O0

void assert_print_object(char *expected,char *input)

{
  long lVar1;
  cJSON_bool cVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  char *input_local;
  char *expected_local;
  parse_buffer parsebuffer;
  printbuffer unformatted_buffer;
  printbuffer formatted_buffer;
  cJSON item [1];
  uchar printed_formatted [1024];
  uchar printed_unformatted [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&unformatted_buffer.hooks.reallocate,0,0x40);
  memset(&parsebuffer.hooks.reallocate,0,0x40);
  memset(&expected_local,0,0x38);
  expected_local = input;
  sVar3 = strlen(input);
  parsebuffer.content = (uchar *)(sVar3 + 1);
  parsebuffer.depth = (size_t)global_hooks.allocate;
  parsebuffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  parsebuffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  unformatted_buffer.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)&item[0].string;
  formatted_buffer.buffer = (uchar *)0x400;
  formatted_buffer.length = 0;
  formatted_buffer.depth._0_4_ = 1;
  formatted_buffer._32_8_ = global_hooks.allocate;
  formatted_buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  formatted_buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  parsebuffer.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)(printed_formatted + 0x3f8);
  unformatted_buffer.buffer = (uchar *)0x400;
  unformatted_buffer.length = 0;
  unformatted_buffer.depth._0_4_ = 1;
  unformatted_buffer._32_8_ = global_hooks.allocate;
  unformatted_buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  unformatted_buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  memset(&formatted_buffer.hooks.reallocate,0,0x40);
  cVar2 = parse_object((cJSON *)&formatted_buffer.hooks.reallocate,(parse_buffer *)&expected_local);
  if (cVar2 == 0) {
    UnityFail("Failed to parse object.",0x3a);
  }
  unformatted_buffer.depth._4_4_ = 0;
  cVar2 = print_object((cJSON *)&formatted_buffer.hooks.reallocate,
                       (printbuffer *)&parsebuffer.hooks.reallocate);
  if (cVar2 == 0) {
    UnityFail("Failed to print unformatted string.",0x3d);
  }
  UnityAssertEqualString
            (input,(char *)(printed_formatted + 0x3f8),"Unformatted object is not correct.",0x3e);
  formatted_buffer.depth._4_4_ = 1;
  cVar2 = print_object((cJSON *)&formatted_buffer.hooks.reallocate,
                       (printbuffer *)&unformatted_buffer.hooks.reallocate);
  if (cVar2 == 0) {
    UnityFail("Failed to print formatted string.",0x41);
  }
  UnityAssertEqualString(expected,(char *)&item[0].string,"Formatted object is not correct.",0x42);
  reset((cJSON *)&formatted_buffer.hooks.reallocate);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_print_object(const char * const expected, const char * const input)
{
    unsigned char printed_unformatted[1024];
    unsigned char printed_formatted[1024];

    cJSON item[1];

    printbuffer formatted_buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    printbuffer unformatted_buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };

    /* buffer for parsing */
    parsebuffer.content = (const unsigned char*)input;
    parsebuffer.length = strlen(input) + sizeof("");
    parsebuffer.hooks = global_hooks;

    /* buffer for formatted printing */
    formatted_buffer.buffer = printed_formatted;
    formatted_buffer.length = sizeof(printed_formatted);
    formatted_buffer.offset = 0;
    formatted_buffer.noalloc = true;
    formatted_buffer.hooks = global_hooks;

    /* buffer for unformatted printing */
    unformatted_buffer.buffer = printed_unformatted;
    unformatted_buffer.length = sizeof(printed_unformatted);
    unformatted_buffer.offset = 0;
    unformatted_buffer.noalloc = true;
    unformatted_buffer.hooks = global_hooks;

    memset(item, 0, sizeof(item));
    TEST_ASSERT_TRUE_MESSAGE(parse_object(item, &parsebuffer), "Failed to parse object.");

    unformatted_buffer.format = false;
    TEST_ASSERT_TRUE_MESSAGE(print_object(item, &unformatted_buffer), "Failed to print unformatted string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(input, printed_unformatted, "Unformatted object is not correct.");

    formatted_buffer.format = true;
    TEST_ASSERT_TRUE_MESSAGE(print_object(item, &formatted_buffer), "Failed to print formatted string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, printed_formatted, "Formatted object is not correct.");

    reset(item);
}